

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O0

bool __thiscall lsim::SimComponent::read_pin_checked(SimComponent *this,uint32_t index)

{
  Simulator *this_00;
  Value VVar1;
  size_type sVar2;
  reference pvVar3;
  bool local_29;
  Value value;
  uint32_t index_local;
  SimComponent *this_local;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pins);
  if (index < sVar2) {
    this_00 = this->m_sim;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_pins,(ulong)index);
    VVar1 = Simulator::read_pin(this_00,*pvVar3);
    local_29 = VALUE_TRUE < VVar1;
    this->m_read_bad = (this->m_read_bad & 1U) != 0 || local_29;
    return VVar1 != VALUE_FALSE;
  }
  __assert_fail("index < m_pins.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_component.cpp"
                ,0x4b,"bool lsim::SimComponent::read_pin_checked(uint32_t)");
}

Assistant:

bool SimComponent::read_pin_checked(uint32_t index) {
	assert(index < m_pins.size());
	auto value = m_sim->read_pin(m_pins[index]);
	m_read_bad |= (value != VALUE_TRUE && value != VALUE_FALSE);
	return static_cast<bool>(value);
}